

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.h
# Opt level: O2

void __thiscall
kj::Function<void_()>::
Impl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-xthread-test.c++:320:17)>
::operator()(Impl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_xthread_test_c__:320:17)>
             *this)

{
  SourceLocation location;
  Waiter *pWVar1;
  PromiseFulfillerPair<void> paf;
  WaitScope waitScope;
  PredicateImpl impl;
  EventLoop loop;
  UnixEventPort port;
  Mutex *local_230;
  Maybe<kj::_::Mutex::Waiter_&> local_228;
  char *local_220;
  char *pcStackY_218;
  undefined8 in_stack_fffffffffffffdf0;
  PromiseFulfillerPair<void> local_1f0;
  WaitScope local_1d8;
  undefined **local_1b8;
  Maybe<kj::_::Mutex::Waiter_&> local_1b0;
  Waiter *local_1a8;
  undefined1 local_1a0;
  EventLoop local_190;
  UnixEventPort local_118;
  
  UnixEventPort::UnixEventPort(&local_118);
  EventLoop::EventLoop(&local_190,&local_118.super_EventPort);
  local_1d8.busyPollInterval = 0xffffffff;
  local_1d8.fiber.ptr = (FiberBase *)0x0;
  local_1d8.runningStacksPool.ptr = (FiberPool *)0x0;
  local_1d8.loop = &local_190;
  EventLoop::enterScope(&local_190);
  location.function =
       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-xthread-test.c++"
  ;
  location.fileName = (char *)in_stack_fffffffffffffdf0;
  location._16_8_ = "operator()";
  newPromiseAndFulfiller<void>(location);
  Own<kj::PromiseFulfiller<void>,_std::nullptr_t>::operator=
            ((this->f).fulfiller,&local_1f0.fulfiller);
  pWVar1 = (Waiter *)getCurrentThreadExecutor();
  MutexGuarded<kj::Maybe<const_kj::Executor_&>_>::lockExclusive
            ((MutexGuarded<kj::Maybe<const_kj::Executor_&>_> *)&local_1b8,(this->f).executor);
  ((local_1b0.ptr)->next).ptr = pWVar1;
  Locked<kj::Maybe<const_kj::Executor_&>_>::~Locked
            ((Locked<kj::Maybe<const_kj::Executor_&>_> *)&local_1b8);
  local_220 = 
  "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-xthread-test.c++"
  ;
  pcStackY_218 = "operator()";
  Promise<void>::wait(&local_1f0.promise,&local_1d8);
  MutexGuarded<kj::Maybe<const_kj::Executor_&>_>::lockExclusive
            ((MutexGuarded<kj::Maybe<const_kj::Executor_&>_> *)&local_230,(this->f).executor);
  local_1b8 = &PTR_check_00581cc0;
  local_1b0.ptr = (Waiter *)&stack0xfffffffffffffdcf;
  local_1a8 = local_228.ptr;
  local_1a0 = 0;
  kj::_::Mutex::wait(local_230,&local_1b8);
  Locked<kj::Maybe<const_kj::Executor_&>_>::~Locked
            ((Locked<kj::Maybe<const_kj::Executor_&>_> *)&local_230);
  PromiseFulfillerPair<void>::~PromiseFulfillerPair(&local_1f0);
  WaitScope::~WaitScope(&local_1d8);
  EventLoop::~EventLoop(&local_190);
  UnixEventPort::~UnixEventPort(&local_118);
  return;
}

Assistant:

Return operator()(Params... params) override {
      return f(kj::fwd<Params>(params)...);
    }